

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
          (callback<void(std::error_code_const&)> *this,_func_void_error_code_ptr *func)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR__refcounted_00109ce8;
  booster::atomic_counter::atomic_counter((atomic_counter *)(puVar1 + 1),0);
  *puVar1 = &PTR__refcounted_00109c80;
  puVar1[2] = func;
  *(undefined8 **)this = puVar1;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}